

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int zisofs_write_to_temp(archive_write *a,void *buff,size_t s)

{
  long *plVar1;
  char cVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  char *pcVar10;
  bool bVar11;
  size_t size;
  ulong uVar12;
  bool bVar13;
  
  pvVar3 = a->format_data;
  lVar4 = *(long *)((long)pvVar3 + 0x10);
  *(long *)((long)pvVar3 + 0x260) = (long)pvVar3 + (0x102dc - *(long *)((long)pvVar3 + 0x102e0));
  *(int *)((long)pvVar3 + 0x268) = (int)*(long *)((long)pvVar3 + 0x102e0);
  do {
    uVar12 = 0x8000 - *(long *)((long)pvVar3 + 600);
    bVar13 = uVar12 <= s;
    if (!bVar13) {
      uVar12 = s;
    }
    lVar9 = *(long *)((long)pvVar3 + 0x2c0) - uVar12;
    *(long *)((long)pvVar3 + 0x2c0) = lVar9;
    *(void **)((long)pvVar3 + 0x248) = buff;
    *(int *)((long)pvVar3 + 0x250) = (int)uVar12;
    bVar8 = *(byte *)((long)pvVar3 + 0x1d8);
    if ((bVar8 & 4) != 0) {
      pcVar10 = (char *)buff;
      do {
        if ((char *)((long)buff + uVar12) <= pcVar10) goto LAB_00170f38;
        cVar2 = *pcVar10;
        pcVar10 = pcVar10 + 1;
      } while (cVar2 == '\0');
      bVar8 = bVar8 & 0xfb;
      *(byte *)((long)pvVar3 + 0x1d8) = bVar8;
    }
LAB_00170f38:
    bVar11 = lVar9 < 1 || bVar13;
    if (((lVar9 < 1 || bVar13) && (bVar8 & 4) != 0) &&
       (*(long *)((long)pvVar3 + 600) + uVar12 == 0x8000)) {
      if (*(long *)((long)pvVar3 + 0x240) != (*(long **)(lVar4 + 0xb0))[1]) {
        iVar6 = wb_set_offset(a,*(long *)((long)pvVar3 + 0x240) + **(long **)(lVar4 + 0xb0));
        if (iVar6 != 0) {
          return iVar6;
        }
        lVar9 = *(long *)((long)pvVar3 + 0x240);
        lVar5 = *(long *)(*(long *)(lVar4 + 0xb0) + 8);
        *(long *)(*(long *)(lVar4 + 0xb0) + 8) = lVar9;
        *(long *)((long)pvVar3 + 0x238) = *(long *)((long)pvVar3 + 0x238) + (lVar9 - lVar5);
      }
      *(undefined4 *)((long)pvVar3 + 0x250) = 0;
LAB_00171076:
      iVar6 = *(int *)((long)pvVar3 + 0x234);
      *(int *)((long)pvVar3 + 0x234) = iVar6 + 1;
      *(undefined4 *)(*(long *)((long)pvVar3 + 0x220) + 4 + (long)iVar6 * 4) =
           *(undefined4 *)((long)pvVar3 + 0x238);
      iVar6 = zisofs_init_zstream(a);
      if (iVar6 != 0) {
        return -0x1e;
      }
      *(byte *)((long)pvVar3 + 0x1d8) = *(byte *)((long)pvVar3 + 0x1d8) | 4;
      *(undefined8 *)((long)pvVar3 + 0x240) = *(undefined8 *)(*(long *)(lVar4 + 0xb0) + 8);
    }
    else {
      if ((int)uVar12 != 0) {
        do {
          lVar9 = *(long *)((long)pvVar3 + 0x270);
          uVar7 = cm_zlib_deflate((z_streamp)((long)pvVar3 + 0x248),(uint)bVar11 << 2);
          if (1 < uVar7) {
            archive_set_error(&a->archive,-1,"Compression failed: deflate() call returned status %d"
                              ,(ulong)uVar7);
            return -0x1e;
          }
          size = *(long *)((long)pvVar3 + 0x270) - lVar9;
          iVar6 = wb_consume(a,size);
          if (iVar6 != 0) {
            return -0x1e;
          }
          *(long *)((long)pvVar3 + 0x238) = *(long *)((long)pvVar3 + 0x238) + size;
          plVar1 = (long *)(*(long *)(*(long *)((long)pvVar3 + 0x10) + 0xb0) + 8);
          *plVar1 = *plVar1 + size;
          lVar9 = *(long *)((long)a->format_data + 0x102e0);
          *(long *)((long)pvVar3 + 0x260) = (long)a->format_data + (0x102dc - lVar9);
          *(int *)((long)pvVar3 + 0x268) = (int)lVar9;
        } while (*(int *)((long)pvVar3 + 0x250) != 0);
      }
      if (bVar11) goto LAB_00171076;
    }
    buff = (void *)((long)buff + uVar12);
    s = s - uVar12;
    if (s == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
zisofs_write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *b;
	z_stream *zstrm;
	size_t avail, csize;
	int flush, r;

	zstrm = &(iso9660->zisofs.stream);
	zstrm->next_out = wb_buffptr(a);
	zstrm->avail_out = (uInt)wb_remaining(a);
	b = (const unsigned char *)buff;
	do {
		avail = ZF_BLOCK_SIZE - zstrm->total_in;
		if (s < avail) {
			avail = s;
			flush = Z_NO_FLUSH;
		} else
			flush = Z_FINISH;
		iso9660->zisofs.remaining -= avail;
		if (iso9660->zisofs.remaining <= 0)
			flush = Z_FINISH;

		zstrm->next_in = (Bytef *)(uintptr_t)(const void *)b;
		zstrm->avail_in = (uInt)avail;

		/*
		 * Check if current data block are all zero.
		 */
		if (iso9660->zisofs.allzero) {
			const unsigned char *nonzero = b;
			const unsigned char *nonzeroend = b + avail;

			while (nonzero < nonzeroend)
				if (*nonzero++) {
					iso9660->zisofs.allzero = 0;
					break;
				}
		}
		b += avail;
		s -= avail;

		/*
		 * If current data block are all zero, we do not use
		 * compressed data.
		 */
		if (flush == Z_FINISH && iso9660->zisofs.allzero &&
		    avail + zstrm->total_in == ZF_BLOCK_SIZE) {
			if (iso9660->zisofs.block_offset !=
			    file->cur_content->size) {
				int64_t diff;

				r = wb_set_offset(a,
				    file->cur_content->offset_of_temp +
				        iso9660->zisofs.block_offset);
				if (r != ARCHIVE_OK)
					return (r);
				diff = file->cur_content->size -
				    iso9660->zisofs.block_offset;
				file->cur_content->size -= diff;
				iso9660->zisofs.total_size -= diff;
			}
			zstrm->avail_in = 0;
		}

		/*
		 * Compress file data.
		 */
		while (zstrm->avail_in > 0) {
			csize = zstrm->total_out;
			r = deflate(zstrm, flush);
			switch (r) {
			case Z_OK:
			case Z_STREAM_END:
				csize = zstrm->total_out - csize;
				if (wb_consume(a, csize) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				iso9660->zisofs.total_size += csize;
				iso9660->cur_file->cur_content->size += csize;
				zstrm->next_out = wb_buffptr(a);
				zstrm->avail_out = (uInt)wb_remaining(a);
				break;
			default:
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Compression failed:"
				    " deflate() call returned status %d",
				    r);
				return (ARCHIVE_FATAL);
			}
		}

		if (flush == Z_FINISH) {
			/*
			 * Save the information of one zisofs block.
			 */
			iso9660->zisofs.block_pointers_idx ++;
			archive_le32enc(&(iso9660->zisofs.block_pointers[
			    iso9660->zisofs.block_pointers_idx]),
				(uint32_t)iso9660->zisofs.total_size);
			r = zisofs_init_zstream(a);
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->zisofs.allzero = 1;
			iso9660->zisofs.block_offset = file->cur_content->size;
		}
	} while (s);

	return (ARCHIVE_OK);
}